

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O2

NDevice * __thiscall
TrodesConfig::getDevice(NDevice *__return_storage_ptr__,TrodesConfig *this,int index)

{
  pointer pNVar1;
  
  pNVar1 = (this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (index < (int)(((long)(this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)pNVar1) / 0x48)) {
    NDevice::NDevice(__return_storage_ptr__,pNVar1 + index);
  }
  else {
    NDevice::NDevice(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

NDevice TrodesConfig::getDevice(int index) const{
    if (index >= (int)devices.size()) {
        return NDevice();
    }
    return devices[index];
}